

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.c
# Opt level: O3

int fiobj_task_wrapper(FIOBJ o,void *p_)

{
  int iVar1;
  uint uVar2;
  fiobj_object_vtable_s *pfVar3;
  
  *(long *)((long)p_ + 0x20) = *(long *)((long)p_ + 0x20) + 1;
  iVar1 = (**p_)(o,*(undefined8 *)((long)p_ + 8));
  if (iVar1 == -1) {
    *(undefined1 *)((long)p_ + 0x28) = 1;
    return -1;
  }
  uVar2 = (uint)o & 6;
  if (uVar2 == 6) {
    return 0;
  }
  if (o == 0) {
    return 0;
  }
  if ((o & 1) != 0) {
    return 0;
  }
  if ((o & 6) == 0) {
    switch(*(undefined1 *)(o & 0xfffffffffffffff8)) {
    case 0x27:
      pfVar3 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case 0x28:
      goto switchD_00145b80_caseD_28;
    case 0x29:
      pfVar3 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case 0x2a:
      goto switchD_00145b80_caseD_2a;
    case 0x2b:
      pfVar3 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar3 = &FIOBJECT_VTABLE_NUMBER;
    }
  }
  else {
    if (uVar2 != 2) {
switchD_00145b80_caseD_2a:
      pfVar3 = &FIOBJECT_VTABLE_HASH;
      goto LAB_00145b92;
    }
switchD_00145b80_caseD_28:
    pfVar3 = &FIOBJECT_VTABLE_STRING;
  }
LAB_00145b92:
  if (pfVar3->each != (_func_size_t_FIOBJ_size_t__func_int_FIOBJ_void_ptr_ptr_void_ptr *)0x0) {
    *(undefined1 *)((long)p_ + 0x29) = 1;
    *(FIOBJ *)((long)p_ + 0x18) = o;
    return -1;
  }
  return 0;
}

Assistant:

static int fiobj_task_wrapper(FIOBJ o, void *p_) {
  struct task_packet_s *p = p_;
  ++p->counter;
  int ret = p->task(o, p->arg);
  if (ret == -1) {
    p->stop = 1;
    return -1;
  }
  if (FIOBJ_IS_ALLOCATED(o) && FIOBJECT2VTBL(o)->each) {
    p->incomplete = 1;
    p->next = o;
    return -1;
  }
  return 0;
}